

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLineParser.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::Yacc::CmdLineParseHandler::SetOptionParam
          (CmdLineParseHandler *this,String *option,String *param,String *value)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  String *value_local;
  String *param_local;
  String *option_local;
  CmdLineParseHandler *this_local;
  
  pmVar1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption>_>_>
           ::operator[](&this->Options,option);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>_>_>
           ::operator[](&pmVar1->Params,param);
  std::__cxx11::string::operator=((string *)&pmVar2->Value,(string *)value);
  return;
}

Assistant:

void CmdLineParseHandler::SetOptionParam(const String& option, const String& param,
                                         const String& value) {
    // Should check to see if it already exists or not
    Options[option].Params[param].Value = value;
}